

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void asl::printf_(char *fmt,...)

{
  bool bVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [8];
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  int local_434;
  int local_430;
  int space;
  int n;
  int i;
  va_list arg;
  char *str;
  char buffer [1000];
  int N;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  arg[0].reg_save_area = &str;
  arg[0].overflow_arg_area = local_4e8;
  arg[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  n = 8;
  space = 0;
  local_430 = 0;
  local_434 = 1000;
  local_4e0 = in_RSI;
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  while( true ) {
    local_430 = vsnprintf((char *)arg[0].reg_save_area,(long)local_434,fmt,&n);
    if ((local_430 == -1) || (bVar1 = false, local_434 < local_430)) {
      space = space + 1;
      bVar1 = space < 10;
    }
    if (!bVar1) break;
    if ((1000 < local_434) && (arg[0].reg_save_area != (void *)0x0)) {
      operator_delete__(arg[0].reg_save_area);
    }
    local_434 = local_434 << 1;
    uVar2 = (ulong)local_434;
    if ((long)uVar2 < 0) {
      uVar2 = 0xffffffffffffffff;
    }
    arg[0].reg_save_area = operator_new__(uVar2);
  }
  fwrite(arg[0].reg_save_area,(long)local_430,1,_stdout);
  if ((1000 < local_434) && (arg[0].reg_save_area != (void *)0x0)) {
    operator_delete__(arg[0].reg_save_area);
  }
  return;
}

Assistant:

void printf_(const char* fmt, ...)
{
	const int N = 1000;
	char    buffer[N];
	char* str = buffer;
	va_list arg;
	va_start(arg, fmt);
	int i=0, n=0;
	int space = N;
	while(((n=vsnprintf(str, space, fmt, arg)) == -1 || n > space) && ++i < 10)
	{
		if (space > N)
			delete [] str;
		space *= 2;
		str = new char[space];
	}
	va_end(arg);
	fwrite(str, n, 1, stdout);
	if (space > N)
		delete [] str;
}